

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<int>::RepeatedField(RepeatedField<int> *this,Arena *arena)

{
  ulong uVar1;
  Arena *this_00;
  unsigned_long uVar2;
  LogMessage *pLVar3;
  Arena *arena_local;
  RepeatedField<int> *this_local;
  byte local_b9;
  LogMessage local_b8;
  ulong local_80;
  Arena *local_78;
  Rep *local_70;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  ulong local_18;
  Arena *local_10;
  
  this->current_size_ = 0;
  this->total_size_ = 0;
  this->rep_ = (Rep *)0x0;
  if (arena != (Arena *)0x0) {
    local_80 = 8;
    local_78 = arena;
    uVar2 = std::numeric_limits<unsigned_long>::max();
    local_b9 = 0;
    if (uVar2 < 8) {
      internal::LogMessage::LogMessage
                (&local_b8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/arena.h"
                 ,0x1c6);
      local_b9 = 1;
      pLVar3 = internal::LogMessage::operator<<
                         (&local_b8,
                          "CHECK failed: (num_elements) <= (std::numeric_limits<size_t>::max() / sizeof(T)): "
                         );
      pLVar3 = internal::LogMessage::operator<<
                         (pLVar3,"Requested size is too large to fit into size_t.");
      internal::LogFinisher::operator=((LogFinisher *)((long)&this_local + 3),pLVar3);
    }
    if ((local_b9 & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_b8);
    }
    this_00 = local_78;
    uVar1 = local_80;
    if (local_78 == (Arena *)0x0) {
      local_70 = (Rep *)operator_new__(local_80);
    }
    else {
      local_10 = local_78;
      local_18 = local_80;
      uVar2 = std::numeric_limits<unsigned_long>::max();
      local_51 = 0;
      if (uVar2 < uVar1) {
        internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/arena.h"
                   ,0x28c);
        local_51 = 1;
        pLVar3 = internal::LogMessage::operator<<
                           (&local_50,
                            "CHECK failed: (num_elements) <= (std::numeric_limits<size_t>::max() / sizeof(T)): "
                           );
        pLVar3 = internal::LogMessage::operator<<
                           (pLVar3,"Requested size is too large to fit into size_t.");
        internal::LogFinisher::operator=(local_65,pLVar3);
      }
      if ((local_51 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_50);
      }
      local_70 = (Rep *)Arena::AllocateAligned(this_00,(type_info *)&char::typeinfo,local_18);
    }
    this->rep_ = local_70;
    this->rep_->arena = arena;
  }
  return;
}

Assistant:

inline RepeatedField<Element>::RepeatedField(Arena* arena)
  : current_size_(0),
    total_size_(0),
    rep_(NULL) {
  // In case arena is NULL, then we do not create rep_, as code has an invariant
  // `rep_ == NULL then arena == NULL`.
  if (arena != NULL) {
    rep_ = reinterpret_cast<Rep*>(
        ::google::protobuf::Arena::CreateArray<char>(arena, kRepHeaderSize));
    rep_->arena = arena;
  }
}